

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_serial_unix.cxx
# Opt level: O2

void ndiSerialClose(int serial_port)

{
  int *piVar1;
  long lVar2;
  int *piVar3;
  
  lVar2 = 0;
  piVar1 = ndi_open_handles;
  do {
    piVar3 = piVar1;
    if (lVar2 == -0xf0) goto LAB_00109ad7;
    lVar2 = lVar2 + -0x3c;
    piVar1 = piVar3 + 1;
  } while (*piVar3 == -1 || *piVar3 != serial_port);
  tcsetattr(serial_port,0,(termios *)((long)ndi_open_handles + (4 - lVar2)));
  *piVar3 = -1;
LAB_00109ad7:
  fcntl(serial_port,6,&ndiSerialClose::fu);
  close(serial_port);
  return;
}

Assistant:

ndicapiExport void ndiSerialClose(int serial_port)
{
  static struct flock fu = { F_UNLCK, 0, 0, 0 }; /* for file unlocking */
  int i;

  /* restore the comm port state to from before it was opened */
  for (i = 0; i < NDI_MAX_SAVE_STATE; i++)
  {
    if (ndi_open_handles[i] == serial_port && ndi_open_handles[i] != -1)
    {
      tcsetattr(serial_port, TCSANOW, &ndi_save_termios[i]);
      ndi_open_handles[i] = -1;
      break;
    }
  }

  /* release our lock on the serial port */
  fcntl(serial_port, F_SETLK, &fu);

  close(serial_port);
}